

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsNodeID.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::CommunicationsNodeID::Decode(CommunicationsNodeID *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    EntityIdentifier::Decode(&this->super_EntityIdentifier,stream);
    KDataStream::Read<unsigned_short>
              (stream,(unsigned_short *)
                      &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void CommunicationsNodeID::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < COMMUNICATIONS_NODE_ID_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    EntityIdentifier::Decode( stream );
    stream >> m_ui16ElementID;
}